

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O0

bool __thiscall BamTools::MergeTool::MergeToolPrivate::Run(MergeToolPrivate *this)

{
  byte bVar1;
  bool bVar2;
  __type _Var3;
  undefined1 uVar4;
  char *pcVar5;
  ostream *poVar6;
  istream *piVar7;
  long *in_RDI;
  BamAlignment al_2;
  BamAlignment al_1;
  BamRegion region;
  BamAlignment al;
  BamWriter writer;
  CompressionMode compressionMode;
  bool writeUncompressed;
  RefVector references;
  string mergedHeader;
  BamMultiReader reader;
  string line;
  ifstream filelist;
  BamAlignment *in_stack_fffffffffffff888;
  BamAlignment *in_stack_fffffffffffff890;
  value_type *in_stack_fffffffffffff898;
  ostream *in_stack_fffffffffffff8a0;
  undefined6 in_stack_fffffffffffff8a8;
  undefined1 in_stack_fffffffffffff8ae;
  undefined1 in_stack_fffffffffffff8af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined1 in_stack_fffffffffffff8bc;
  undefined1 in_stack_fffffffffffff8bf;
  BamMultiReader *in_stack_fffffffffffff8c0;
  BamAlignment *in_stack_fffffffffffff8d0;
  byte local_721;
  int local_6a8;
  int local_620;
  int local_61c;
  BamRegion *in_stack_fffffffffffffa18;
  BamMultiReader *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa28;
  int local_410 [4];
  BamRegion local_400 [23];
  uint local_290;
  byte local_289;
  string local_270 [40];
  string local_248 [32];
  int local_228;
  istream local_218 [535];
  byte local_1;
  
  if (((*(byte *)*in_RDI & 1) == 0) && ((*(byte *)(*in_RDI + 1) & 1) == 0)) {
    Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  }
  if ((*(byte *)(*in_RDI + 1) & 1) != 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_218,pcVar5,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "bamtools merge ERROR: could not open input BAM file list... Aborting."
                              );
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_228 = 1;
    }
    else {
      std::__cxx11::string::string(local_248);
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (!bVar2) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      }
      std::__cxx11::string::~string(local_248);
      local_228 = 0;
    }
    std::ifstream::~ifstream(local_218);
    if (local_228 != 0) goto LAB_00148105;
  }
  BamMultiReader::BamMultiReader((BamMultiReader *)in_stack_fffffffffffff8a0);
  bVar2 = BamMultiReader::Open
                    ((BamMultiReader *)in_stack_fffffffffffff890,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff888);
  if (bVar2) {
    BamMultiReader::GetHeaderText_abi_cxx11_((BamMultiReader *)in_stack_fffffffffffff888);
    BamMultiReader::GetReferenceData((BamMultiReader *)in_stack_fffffffffffff888);
    Options::StandardOut_abi_cxx11_();
    _Var3 = std::operator==(in_stack_fffffffffffff8b0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff8af,
                                     CONCAT16(in_stack_fffffffffffff8ae,in_stack_fffffffffffff8a8)))
    ;
    local_721 = 0;
    if (_Var3) {
      local_721 = *(byte *)(*in_RDI + 3) ^ 0xff;
    }
    local_289 = local_721 & 1;
    local_290 = (uint)(local_289 != 0);
    BamWriter::BamWriter((BamWriter *)in_stack_fffffffffffff8a0);
    BamWriter::SetCompressionMode
              ((BamWriter *)in_stack_fffffffffffff890,(CompressionMode *)in_stack_fffffffffffff888);
    bVar2 = BamWriter::Open((BamWriter *)in_stack_fffffffffffff8a0,
                            (string *)in_stack_fffffffffffff898,&in_stack_fffffffffffff890->Name,
                            (RefVector *)in_stack_fffffffffffff888);
    if (bVar2) {
      if ((*(byte *)(*in_RDI + 4) & 1) == 0) {
        BamAlignment::BamAlignment(in_stack_fffffffffffff8d0);
        while (bVar2 = BamMultiReader::GetNextAlignmentCore
                                 ((BamMultiReader *)in_stack_fffffffffffff890,
                                  in_stack_fffffffffffff888), bVar2) {
          BamWriter::SaveAlignment((BamWriter *)in_stack_fffffffffffff890,in_stack_fffffffffffff888)
          ;
        }
        BamAlignment::~BamAlignment(in_stack_fffffffffffff890);
      }
      else {
        local_410[3] = 0xffffffff;
        local_410[2] = 0xffffffff;
        local_410[1] = 0xffffffff;
        local_410[0] = -1;
        BamRegion::BamRegion(local_400,local_410 + 3,local_410 + 2,local_410 + 1,local_410);
        uVar4 = Utilities::ParseRegionString
                          (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                           in_stack_fffffffffffffa18);
        if (!(bool)uVar4) {
          in_stack_fffffffffffff8a0 =
               std::operator<<((ostream *)&std::cerr,
                               "bamtools merge ERROR: could not parse REGION - ");
          poVar6 = std::operator<<(in_stack_fffffffffffff8a0,(string *)(*in_RDI + 0x60));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          in_stack_fffffffffffff890 =
               (BamAlignment *)
               std::operator<<((ostream *)&std::cerr,
                               "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                              );
          std::ostream::operator<<(in_stack_fffffffffffff890,std::endl<char,std::char_traits<char>>)
          ;
          BamMultiReader::Close((BamMultiReader *)0x14803c);
          BamWriter::Close((BamWriter *)0x14804b);
          local_1 = 0;
          goto LAB_00148095;
        }
        BamMultiReader::LocateIndexes
                  ((BamMultiReader *)in_stack_fffffffffffff890,
                   (IndexType *)in_stack_fffffffffffff888);
        bVar2 = BamMultiReader::HasIndexes((BamMultiReader *)0x147db4);
        if (bVar2) {
          bVar2 = BamMultiReader::SetRegion
                            (in_stack_fffffffffffff8c0,
                             (int *)CONCAT17(in_stack_fffffffffffff8bf,
                                             CONCAT16(uVar4,CONCAT15(bVar2,CONCAT14(
                                                  in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8)))),
                             (int *)in_stack_fffffffffffff8b0,
                             (int *)CONCAT17(in_stack_fffffffffffff8af,
                                             CONCAT16(in_stack_fffffffffffff8ae,
                                                      in_stack_fffffffffffff8a8)),
                             (int *)in_stack_fffffffffffff8a0);
          if (!bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "bamtools merge ERROR: set region failed. Check that REGION describes a valid range"
                                    );
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            BamMultiReader::Close((BamMultiReader *)0x147e3e);
            local_1 = 0;
            goto LAB_00148095;
          }
          BamAlignment::BamAlignment(in_stack_fffffffffffff8d0);
          while (bVar2 = BamMultiReader::GetNextAlignmentCore
                                   ((BamMultiReader *)in_stack_fffffffffffff890,
                                    in_stack_fffffffffffff888), bVar2) {
            BamWriter::SaveAlignment
                      ((BamWriter *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
          }
          BamAlignment::~BamAlignment(in_stack_fffffffffffff890);
        }
        else {
          BamAlignment::BamAlignment(in_stack_fffffffffffff8d0);
          while (bVar2 = BamMultiReader::GetNextAlignmentCore
                                   ((BamMultiReader *)in_stack_fffffffffffff890,
                                    in_stack_fffffffffffff888), bVar2) {
            if ((((local_400[0].LeftRefID <= local_620) &&
                 (local_400[0].LeftPosition <= local_61c + local_6a8)) &&
                (local_620 <= local_400[0].RightRefID)) && (local_61c <= local_400[0].RightPosition)
               ) {
              BamWriter::SaveAlignment
                        ((BamWriter *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
            }
          }
          BamAlignment::~BamAlignment(in_stack_fffffffffffff890);
        }
      }
      BamMultiReader::Close((BamMultiReader *)0x148071);
      BamWriter::Close((BamWriter *)0x148080);
      local_1 = 1;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"bamtools merge ERROR: could not open ");
      poVar6 = std::operator<<(poVar6,(string *)(*in_RDI + 0x40));
      poVar6 = std::operator<<(poVar6," for writing.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      BamMultiReader::Close((BamMultiReader *)0x147c24);
      local_1 = 0;
    }
LAB_00148095:
    local_228 = 1;
    BamWriter::~BamWriter((BamWriter *)in_stack_fffffffffffff890);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               in_stack_fffffffffffff8a0);
    std::__cxx11::string::~string(local_270);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "bamtools merge ERROR: could not open input BAM file(s)... Aborting.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_228 = 1;
  }
  BamMultiReader::~BamMultiReader((BamMultiReader *)in_stack_fffffffffffff890);
LAB_00148105:
  return (bool)(local_1 & 1);
}

Assistant:

bool MergeTool::MergeToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist) {
        m_settings->InputFiles.push_back(Options::StandardIn());
    }

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools merge ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line)) {
            m_settings->InputFiles.push_back(line);
        }
    }

    // opens the BAM files (by default without checking for indexes)
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools merge ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // retrieve header & reference dictionary info
    std::string mergedHeader = reader.GetHeaderText();
    RefVector references = reader.GetReferenceData();

    // determine compression mode for BamWriter
    bool writeUncompressed =
        (m_settings->OutputFilename == Options::StandardOut() && !m_settings->IsForceCompression);
    BamWriter::CompressionMode compressionMode = BamWriter::Compressed;
    if (writeUncompressed) {
        compressionMode = BamWriter::Uncompressed;
    }

    // open BamWriter
    BamWriter writer;
    writer.SetCompressionMode(compressionMode);
    if (!writer.Open(m_settings->OutputFilename, mergedHeader, references)) {
        std::cerr << "bamtools merge ERROR: could not open " << m_settings->OutputFilename
                  << " for writing." << std::endl;
        reader.Close();
        return false;
    }

    // if no region specified, store entire contents of file(s)
    if (!m_settings->HasRegion) {
        BamAlignment al;
        while (reader.GetNextAlignmentCore(al)) {
            writer.SaveAlignment(al);
        }
    }

    // otherwise attempt to use region as constraint
    else {

        // if region string parses OK
        BamRegion region;
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            // attempt to find index files
            reader.LocateIndexes();

            // if index data available for all BAM files, we can use SetRegion
            if (reader.HasIndexes()) {

                // attempt to use SetRegion(), if failed report error
                if (!reader.SetRegion(region.LeftRefID, region.LeftPosition, region.RightRefID,
                                      region.RightPosition)) {
                    std::cerr << "bamtools merge ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }

                // everything checks out, just iterate through specified region, storing alignments
                BamAlignment al;
                while (reader.GetNextAlignmentCore(al)) {
                    writer.SaveAlignment(al);
                }
            }

            // no index data available, we have to iterate through until we
            // find overlapping alignments
            else {
                BamAlignment al;
                while (reader.GetNextAlignmentCore(al)) {
                    if ((al.RefID >= region.LeftRefID) &&
                        ((al.Position + al.Length) >= region.LeftPosition) &&
                        (al.RefID <= region.RightRefID) && (al.Position <= region.RightPosition)) {
                        writer.SaveAlignment(al);
                    }
                }
            }
        }

        // error parsing REGION string
        else {
            std::cerr << "bamtools merge ERROR: could not parse REGION - " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            writer.Close();
            return false;
        }
    }

    // clean & exit
    reader.Close();
    writer.Close();
    return true;
}